

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintNgeneric.cpp
# Opt level: O2

void __thiscall
chrono::ChConstraintNgeneric::MultiplyTandAdd
          (ChConstraintNgeneric *this,ChVectorDynamic<double> *result,double l)

{
  pointer ppCVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  long local_a0;
  double local_98;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_90;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> local_68 [56];
  
  lVar3 = 0;
  local_98 = l;
  for (uVar2 = 0;
      ppCVar1 = (this->variables).
                super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(this->variables).
                            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar1 >> 3);
      uVar2 = uVar2 + 1) {
    if (ppCVar1[uVar2]->disabled == false) {
      local_a0 = (long)&(((this->Cq).
                          super__Vector_base<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_std::allocator<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).m_storage.
                        m_data + lVar3;
      Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,1,-1,1,1,-1>>>::operator*
                (&local_90,
                 (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,1,_1,1,1,_1>>> *)&local_a0,
                 &local_98);
      Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_68,result,
                 (long)(this->variables).
                       super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar2]->offset,
                 *(Index *)((long)&(((this->Cq).
                                     super__Vector_base<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_std::allocator<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                                   m_storage.m_cols + lVar3));
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator+=
                (local_68,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                           *)&local_90);
    }
    lVar3 = lVar3 + 0x10;
  }
  return;
}

Assistant:

void ChConstraintNgeneric::MultiplyTandAdd(ChVectorDynamic<double>& result, double l) {
    for (size_t i = 0; i < variables.size(); ++i) {
        if (variables[i]->IsActive()) {
            result.segment(variables[i]->GetOffset(), Cq[i].size()) += Cq[i].transpose() * l;
        }
    }
}